

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall
t_cpp_generator::generate_deserialize_field
          (t_cpp_generator *this,ostream *out,t_field *tfield,string *prefix,string *suffix)

{
  pointer pcVar1;
  int iVar2;
  t_struct *tstruct;
  long *plVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  size_type *psVar6;
  t_base_type *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  undefined1 auVar8 [12];
  string name;
  string t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  tstruct = (t_struct *)t_type::get_true_type(tfield->type_);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[4])(tstruct);
  if ((char)iVar2 != '\0') {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(&local_150,"CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: ",prefix);
    std::operator+(pbVar5,&local_150,&tfield->name_);
    __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  std::operator+(&local_130,prefix,&tfield->name_);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_130,(ulong)(suffix->_M_dataplus)._M_p);
  psVar6 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_150.field_2._M_allocated_capacity = *psVar6;
    local_150.field_2._8_8_ = plVar3[3];
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  }
  else {
    local_150.field_2._M_allocated_capacity = *psVar6;
    local_150._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_150._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xb])(tstruct);
  if (((char)iVar2 == '\0') &&
     (iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xc])(tstruct), (char)iVar2 == '\0')
     ) {
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xd])(tstruct);
    if ((char)iVar2 != '\0') {
      paVar7 = &local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_150._M_dataplus._M_p,
                 local_150._M_dataplus._M_p + local_150._M_string_length);
      generate_deserialize_container(this,out,(t_type *)tstruct,&local_70);
      local_130._M_dataplus._M_p = local_70._M_dataplus._M_p;
      goto LAB_0018806b;
    }
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[5])(tstruct);
    if ((char)iVar2 != '\0') {
      poVar4 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"xfer += iprot->",0xf);
      this_00 = (t_base_type *)
                (ulong)*(uint *)&(tstruct->members_).
                                 super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                                 super__Vector_impl_data._M_start;
      switch(this_00) {
      case (t_base_type *)0x0:
        pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        std::operator+(pbVar5,"compiler error: cannot serialize void field in a struct: ",&local_150
                      );
        __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      case (t_base_type *)0x1:
        iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[7])(tstruct);
        if ((char)iVar2 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(out,"readString(",0xb);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(out,"readBinary(",0xb);
        }
        break;
      case (t_base_type *)0x2:
        std::__ostream_insert<char,std::char_traits<char>>(out,"readBool(",9);
        break;
      case (t_base_type *)0x3:
        std::__ostream_insert<char,std::char_traits<char>>(out,"readByte(",9);
        break;
      case (t_base_type *)0x4:
        std::__ostream_insert<char,std::char_traits<char>>(out,"readI16(",8);
        break;
      case (t_base_type *)0x5:
        std::__ostream_insert<char,std::char_traits<char>>(out,"readI32(",8);
        break;
      case (t_base_type *)0x6:
        std::__ostream_insert<char,std::char_traits<char>>(out,"readI64(",8);
        break;
      case (t_base_type *)0x7:
        std::__ostream_insert<char,std::char_traits<char>>(out,"readDouble(",0xb);
        break;
      default:
        auVar8 = __cxa_allocate_exception(0x20);
        t_base_type::t_base_name_abi_cxx11_(&local_110,this_00,auVar8._8_4_);
        std::operator+(&local_130,"compiler error: no C++ reader for base type ",&local_110);
        std::operator+(auVar8._0_8_,&local_130,&local_150);
        __cxa_throw(auVar8._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_150._M_dataplus._M_p,local_150._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      goto LAB_00188075;
    }
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct);
    if ((char)iVar2 == '\0') {
      pcVar1 = (tfield->name_)._M_dataplus._M_p;
      type_name_abi_cxx11_(&local_130,this,(t_type *)tstruct,false,false);
      printf("DO NOT KNOW HOW TO DESERIALIZE FIELD \'%s\' TYPE \'%s\'\n",pcVar1,
             local_130._M_dataplus._M_p);
    }
    else {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"ecast","");
      t_generator::tmp(&local_130,(t_generator *)this,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_110._M_dataplus._M_p,local_110._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"int32_t ",8);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_130._M_dataplus._M_p,local_130._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,";",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"xfer += iprot->readI32(",0x17);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_130._M_dataplus._M_p,local_130._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,");",2);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_150._M_dataplus._M_p,local_150._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = static_cast<",0xf);
      type_name_abi_cxx11_(&local_f0,this,(t_type *)tstruct,false,false);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,">(",2);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_130._M_dataplus._M_p,local_130._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p == &local_130.field_2) goto LAB_00188075;
  }
  else {
    paVar7 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_150._M_dataplus._M_p,
               local_150._M_dataplus._M_p + local_150._M_string_length);
    generate_deserialize_struct(this,out,tstruct,&local_50,tfield->reference_);
    local_130._M_dataplus._M_p = local_50._M_dataplus._M_p;
LAB_0018806b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p == paVar7) goto LAB_00188075;
  }
  operator_delete(local_130._M_dataplus._M_p);
LAB_00188075:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_deserialize_field(ostream& out,
                                                 t_field* tfield,
                                                 string prefix,
                                                 string suffix) {
  t_type* type = get_true_type(tfield->get_type());

  if (type->is_void()) {
    throw "CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
  }

  string name = prefix + tfield->get_name() + suffix;

  if (type->is_struct() || type->is_xception()) {
    generate_deserialize_struct(out, (t_struct*)type, name, is_reference(tfield));
  } else if (type->is_container()) {
    generate_deserialize_container(out, type, name);
  } else if (type->is_base_type()) {
    indent(out) << "xfer += iprot->";
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_VOID:
      throw "compiler error: cannot serialize void field in a struct: " + name;
      break;
    case t_base_type::TYPE_STRING:
      if (type->is_binary()) {
        out << "readBinary(" << name << ");";
      } else {
        out << "readString(" << name << ");";
      }
      break;
    case t_base_type::TYPE_BOOL:
      out << "readBool(" << name << ");";
      break;
    case t_base_type::TYPE_I8:
      out << "readByte(" << name << ");";
      break;
    case t_base_type::TYPE_I16:
      out << "readI16(" << name << ");";
      break;
    case t_base_type::TYPE_I32:
      out << "readI32(" << name << ");";
      break;
    case t_base_type::TYPE_I64:
      out << "readI64(" << name << ");";
      break;
    case t_base_type::TYPE_DOUBLE:
      out << "readDouble(" << name << ");";
      break;
    default:
      throw "compiler error: no C++ reader for base type " + t_base_type::t_base_name(tbase) + name;
    }
    out << endl;
  } else if (type->is_enum()) {
    string t = tmp("ecast");
    out << indent() << "int32_t " << t << ";" << endl << indent() << "xfer += iprot->readI32(" << t
        << ");" << endl << indent() << name << " = static_cast<" 
        << type_name(type) << ">(" << t << ");" << endl;
  } else {
    printf("DO NOT KNOW HOW TO DESERIALIZE FIELD '%s' TYPE '%s'\n",
           tfield->get_name().c_str(),
           type_name(type).c_str());
  }
}